

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDsd.c
# Opt level: O0

DdNode * Extra_bddComputeSum(DdManager *dd,DdNode **pbCubes,int nCubes)

{
  DdNode *n;
  int local_34;
  int i;
  DdNode *bTemp;
  DdNode *bRes;
  int nCubes_local;
  DdNode **pbCubes_local;
  DdManager *dd_local;
  
  bTemp = (DdNode *)((ulong)dd->one ^ 1);
  Cudd_Ref(bTemp);
  for (local_34 = 0; local_34 < nCubes; local_34 = local_34 + 1) {
    n = Cudd_bddOr(dd,bTemp,pbCubes[local_34]);
    Cudd_Ref(n);
    Cudd_RecursiveDeref(dd,bTemp);
    bTemp = n;
  }
  Cudd_Deref(bTemp);
  return bTemp;
}

Assistant:

DdNode * Extra_bddComputeSum( DdManager * dd, DdNode ** pbCubes, int nCubes )
{
    DdNode * bRes, * bTemp;
    int i;
    bRes = b0; Cudd_Ref( bRes );
    for ( i = 0; i < nCubes; i++ )
    {
        bRes = Cudd_bddOr( dd, bTemp = bRes, pbCubes[i] );  Cudd_Ref( bRes );
        Cudd_RecursiveDeref( dd, bTemp );
    }
    Cudd_Deref( bRes );
    return bRes;
}